

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

string_t duckdb::CastFromBitToString::Operation<duckdb::string_t>(string_t input,Vector *vector)

{
  Vector *vector_00;
  ulong uVar1;
  char *in_RCX;
  idx_t len;
  undefined1 *puVar2;
  bitstring_t bits;
  bitstring_t bits_00;
  string_t result;
  undefined1 local_28 [16];
  
  bits.value._0_8_ = input.value._8_8_;
  bits.value.pointer.ptr = (char *)vector;
  vector_00 = (Vector *)Bit::BitLength(input.value._0_8_,bits);
  local_28 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  puVar2 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    puVar2 = local_28 + 4;
  }
  bits_00.value.pointer.ptr = puVar2;
  bits_00.value._0_8_ = bits.value._0_8_;
  Bit::ToString(input.value._0_8_,bits_00,in_RCX);
  uVar1 = (ulong)(uint)local_28._0_4_;
  if (uVar1 < 0xd) {
    switchD_0105b559::default(local_28 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28;
}

Assistant:

string_t CastFromBitToString::Operation(string_t input, Vector &vector) {

	idx_t result_size = Bit::BitLength(input);
	string_t result = StringVector::EmptyString(vector, result_size);
	Bit::ToString(input, result.GetDataWriteable());
	result.Finalize();

	return result;
}